

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

ssize_t __thiscall ListPanel::read(ListPanel *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ssize_t sVar2;
  void *__buf_00;
  undefined4 in_register_00000034;
  ScrollBarVisibility local_1c;
  uint8_t *puStack_18;
  int tmp;
  uint8_t *buf_local;
  ListPanel *this_local;
  
  puStack_18 = (uint8_t *)CONCAT44(in_register_00000034,__fd);
  buf_local = (uint8_t *)this;
  iVar1 = Util::readInt32(puStack_18,(int *)&local_1c);
  puStack_18 = puStack_18 + iVar1;
  this->scrollBarVisibility = local_1c;
  iVar1 = Util::readBool(puStack_18,&this->showItemBorder);
  puStack_18 = puStack_18 + iVar1;
  iVar1 = Util::readBool(puStack_18,&this->showSection);
  puStack_18 = puStack_18 + iVar1;
  iVar1 = Util::readBool(puStack_18,&this->showEmptySection);
  puStack_18 = puStack_18 + iVar1;
  iVar1 = Util::readString(puStack_18,&this->listPanelItemName);
  puStack_18 = puStack_18 + iVar1;
  sVar2 = Widget::read(&this->super_Widget,(int)puStack_18,__buf_00,(long)iVar1);
  return sVar2;
}

Assistant:

uint8_t* ListPanel::read(uint8_t *buf)
{
	int tmp;
	buf += Util::readInt32(buf, tmp);
	scrollBarVisibility = static_cast<ScrollBarVisibility>(tmp);
	buf += Util::readBool(buf, showItemBorder);
	buf += Util::readBool(buf, showSection);
	buf += Util::readBool(buf, showEmptySection);
	buf += Util::readString(buf, listPanelItemName);
	return Widget::read(buf);
}